

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall CLI::Option::check_sname(Option *this,string *name)

{
  pointer pcVar1;
  ptrdiff_t pVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  string local_30;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + name->_M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_48,&this->snames_);
  pVar2 = detail::find_member(&local_30,&vStack_48,
                              (this->super_OptionBase<CLI::Option>).ignore_case_,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return -1 < pVar2;
}

Assistant:

bool check_sname(std::string name) const { return (detail::find_member(name, snames_, ignore_case_) >= 0); }